

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::initTest(TessellationShaderTCTEgl_TessLevel *this)

{
  _tests *this_00;
  pointer *pp_Var1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  iterator iVar6;
  _test_descriptor test_tcs_tes_equal;
  _test_descriptor test_tes_fo;
  _test_descriptor test_tes_fe;
  _test_descriptor test_tes_equal;
  _test_descriptor test_tcs_tes_fo;
  _test_descriptor test_tcs_tes_fe;
  undefined1 local_100 [32];
  GLint GStack_e0;
  _test_descriptor local_dc;
  _test_descriptor local_b8;
  _test_descriptor local_94;
  _test_descriptor local_70;
  _test_descriptor local_4c;
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xcb4);
    (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xcb7);
    (**(code **)(lVar5 + 0x868))
              ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
               &this->m_gl_max_tess_gen_level_value);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_TESS_GEN_LEVEL_EXT pname failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xcbc);
    local_100._24_4_ = 0;
    local_100._28_4_ = 0;
    GStack_e0 = 0;
    local_100._8_8_ = 0;
    local_100._16_4_ = 0;
    local_100._20_4_ = 0;
    local_100._0_8_ = (pointer)0x400000002;
    local_4c.vs_id = 0;
    local_4c.inner_tess_levels_uniform_location = 0;
    local_4c.outer_tess_levels_uniform_location = 0;
    local_4c.fs_id = 0;
    local_4c.po_id = 0;
    local_4c.tcs_id = 0;
    local_4c.tes_id = 0;
    local_4c.type = TESSELLATION_TEST_TYPE_COUNT;
    local_4c.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    local_70.vs_id = 0;
    local_70.inner_tess_levels_uniform_location = 0;
    local_70.outer_tess_levels_uniform_location = 0;
    local_70.fs_id = 0;
    local_70.po_id = 0;
    local_70.tcs_id = 0;
    local_70.tes_id = 0;
    local_70.type = TESSELLATION_TEST_TYPE_COUNT;
    local_70.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    local_94.vs_id = 0;
    local_94.inner_tess_levels_uniform_location = 0;
    local_94.outer_tess_levels_uniform_location = 0;
    local_94.fs_id = 0;
    local_94.po_id = 0;
    local_94.tcs_id = 0;
    local_94.tes_id = 0;
    local_94.type = TESSELLATION_TEST_TYPE_COUNT;
    local_94.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    local_b8.vs_id = 0;
    local_b8.inner_tess_levels_uniform_location = 0;
    local_b8.outer_tess_levels_uniform_location = 0;
    local_b8.fs_id = 0;
    local_b8.po_id = 0;
    local_b8.tcs_id = 0;
    local_b8.tes_id = 0;
    local_b8.type = TESSELLATION_TEST_TYPE_COUNT;
    local_b8.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    local_dc.vs_id = 0;
    local_dc.inner_tess_levels_uniform_location = 0;
    local_dc.outer_tess_levels_uniform_location = 0;
    local_dc.fs_id = 0;
    local_dc.po_id = 0;
    local_dc.tcs_id = 0;
    local_dc.tes_id = 0;
    local_dc.type = TESSELLATION_TEST_TYPE_COUNT;
    local_dc.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,(_test_descriptor *)local_100,
                       TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,&local_4c,
                       TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,&local_70,
                       TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
    uVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar4 & 0x300) != 0) {
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&local_94,
                         TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&local_b8,
                         TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&local_dc,
                         TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
    }
    this_00 = &this->m_tests;
    iVar6._M_current =
         (this->m_tests).
         super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
      ::_M_realloc_insert<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_const&>
                ((vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
                  *)this_00,iVar6,(_test_descriptor *)local_100);
      iVar6._M_current =
           (this->m_tests).
           super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar6._M_current)->outer_tess_levels_uniform_location = GStack_e0;
      (iVar6._M_current)->tcs_id = local_100._16_4_;
      (iVar6._M_current)->tes_id = local_100._20_4_;
      (iVar6._M_current)->vs_id = local_100._24_4_;
      (iVar6._M_current)->inner_tess_levels_uniform_location = local_100._28_4_;
      (iVar6._M_current)->type = local_100._0_4_;
      (iVar6._M_current)->vertex_spacing = local_100._4_4_;
      (iVar6._M_current)->fs_id = local_100._8_4_;
      (iVar6._M_current)->po_id = local_100._12_4_;
      iVar6._M_current =
           (this->m_tests).
           super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_tests).
      super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current;
    }
    if (iVar6._M_current ==
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
      ::_M_realloc_insert<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_const&>
                ((vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
                  *)this_00,iVar6,&local_4c);
      iVar6._M_current =
           (this->m_tests).
           super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar6._M_current)->outer_tess_levels_uniform_location =
           local_4c.outer_tess_levels_uniform_location;
      (iVar6._M_current)->tcs_id = local_4c.tcs_id;
      (iVar6._M_current)->tes_id = local_4c.tes_id;
      (iVar6._M_current)->vs_id = local_4c.vs_id;
      (iVar6._M_current)->inner_tess_levels_uniform_location =
           local_4c.inner_tess_levels_uniform_location;
      (iVar6._M_current)->type = local_4c.type;
      (iVar6._M_current)->vertex_spacing = local_4c.vertex_spacing;
      (iVar6._M_current)->fs_id = local_4c.fs_id;
      (iVar6._M_current)->po_id = local_4c.po_id;
      iVar6._M_current =
           (this->m_tests).
           super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_tests).
      super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current;
    }
    if (iVar6._M_current ==
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
      ::_M_realloc_insert<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_const&>
                ((vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
                  *)this_00,iVar6,&local_70);
    }
    else {
      (iVar6._M_current)->outer_tess_levels_uniform_location =
           local_70.outer_tess_levels_uniform_location;
      (iVar6._M_current)->tcs_id = local_70.tcs_id;
      (iVar6._M_current)->tes_id = local_70.tes_id;
      (iVar6._M_current)->vs_id = local_70.vs_id;
      (iVar6._M_current)->inner_tess_levels_uniform_location =
           local_70.inner_tess_levels_uniform_location;
      (iVar6._M_current)->type = local_70.type;
      (iVar6._M_current)->vertex_spacing = local_70.vertex_spacing;
      (iVar6._M_current)->fs_id = local_70.fs_id;
      (iVar6._M_current)->po_id = local_70.po_id;
      pp_Var1 = &(this->m_tests).
                 super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pp_Var1 = *pp_Var1 + 1;
    }
    uVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar4 & 0x300) != 0) {
      iVar6._M_current =
           (this->m_tests).
           super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->m_tests).
          super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
        ::_M_realloc_insert<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_const&>
                  ((vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
                    *)this_00,iVar6,&local_94);
        iVar6._M_current =
             (this->m_tests).
             super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar6._M_current)->outer_tess_levels_uniform_location =
             local_94.outer_tess_levels_uniform_location;
        (iVar6._M_current)->tcs_id = local_94.tcs_id;
        (iVar6._M_current)->tes_id = local_94.tes_id;
        (iVar6._M_current)->vs_id = local_94.vs_id;
        (iVar6._M_current)->inner_tess_levels_uniform_location =
             local_94.inner_tess_levels_uniform_location;
        (iVar6._M_current)->type = local_94.type;
        (iVar6._M_current)->vertex_spacing = local_94.vertex_spacing;
        (iVar6._M_current)->fs_id = local_94.fs_id;
        (iVar6._M_current)->po_id = local_94.po_id;
        iVar6._M_current =
             (this->m_tests).
             super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current;
      }
      if (iVar6._M_current ==
          (this->m_tests).
          super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
        ::_M_realloc_insert<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_const&>
                  ((vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
                    *)this_00,iVar6,&local_b8);
        iVar6._M_current =
             (this->m_tests).
             super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar6._M_current)->outer_tess_levels_uniform_location =
             local_b8.outer_tess_levels_uniform_location;
        (iVar6._M_current)->tcs_id = local_b8.tcs_id;
        (iVar6._M_current)->tes_id = local_b8.tes_id;
        (iVar6._M_current)->vs_id = local_b8.vs_id;
        (iVar6._M_current)->inner_tess_levels_uniform_location =
             local_b8.inner_tess_levels_uniform_location;
        (iVar6._M_current)->type = local_b8.type;
        (iVar6._M_current)->vertex_spacing = local_b8.vertex_spacing;
        (iVar6._M_current)->fs_id = local_b8.fs_id;
        (iVar6._M_current)->po_id = local_b8.po_id;
        iVar6._M_current =
             (this->m_tests).
             super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar6._M_current;
      }
      if (iVar6._M_current ==
          (this->m_tests).
          super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
        ::_M_realloc_insert<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_const&>
                  ((vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>>
                    *)this_00,iVar6,&local_dc);
      }
      else {
        (iVar6._M_current)->outer_tess_levels_uniform_location =
             local_dc.outer_tess_levels_uniform_location;
        (iVar6._M_current)->tcs_id = local_dc.tcs_id;
        (iVar6._M_current)->tes_id = local_dc.tes_id;
        (iVar6._M_current)->vs_id = local_dc.vs_id;
        (iVar6._M_current)->inner_tess_levels_uniform_location =
             local_dc.inner_tess_levels_uniform_location;
        (iVar6._M_current)->type = local_dc.type;
        (iVar6._M_current)->vertex_spacing = local_dc.vertex_spacing;
        (iVar6._M_current)->fs_id = local_dc.fs_id;
        (iVar6._M_current)->po_id = local_dc.po_id;
        pp_Var1 = &(this->m_tests).
                   super__Vector_base<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
    }
    (**(code **)(lVar5 + 0x6c8))(1,&this->m_bo_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGenBuffers() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xce3);
    (**(code **)(lVar5 + 0x40))(0x8c8e,this->m_bo_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBuffer() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xce6);
    (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_bo_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBufferBase() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xce8);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,"Tessellation shader functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_100);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTCTEgl_TessLevel::initTest()
{
	/* The test requires EXT_tessellation_shader */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value before we carry on */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve gen level */
	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &m_gl_max_tess_gen_level_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_TESS_GEN_LEVEL_EXT pname failed");

	/* Initialize test descriptors */
	_test_descriptor test_tcs_tes_equal;
	_test_descriptor test_tcs_tes_fe;
	_test_descriptor test_tcs_tes_fo;
	_test_descriptor test_tes_equal;
	_test_descriptor test_tes_fe;
	_test_descriptor test_tes_fo;

	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_equal, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_fe,
					   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_fo,
					   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_equal, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_fe,
						   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_fo, TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
	}

	m_tests.push_back(test_tcs_tes_equal);
	m_tests.push_back(test_tcs_tes_fe);
	m_tests.push_back(test_tcs_tes_fo);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		m_tests.push_back(test_tes_equal);
		m_tests.push_back(test_tes_fe);
		m_tests.push_back(test_tes_fo);
	}

	/* Generate and set up a buffer object we will use to hold XFBed data.
	 *
	 * NOTE: We do not set the buffer object's storage here because its size
	 *       is iteration-specific.
	 **/
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	/* We're good to execute the test! */
}